

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerLockDb(Pager *pPager,int eLock)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = pPager->eLock;
  if (bVar1 != 5 && eLock <= (int)(uint)bVar1) {
    return 0;
  }
  if (pPager->noLock == '\0') {
    iVar2 = (*pPager->fd->pMethods->xLock)(pPager->fd,eLock);
    if (iVar2 != 0) {
      return iVar2;
    }
    bVar1 = pPager->eLock;
  }
  if ((eLock == 4) || (bVar1 != 5)) {
    pPager->eLock = (u8)eLock;
  }
  return 0;
}

Assistant:

static int pagerLockDb(Pager *pPager, int eLock){
  int rc = SQLITE_OK;

  assert( eLock==SHARED_LOCK || eLock==RESERVED_LOCK || eLock==EXCLUSIVE_LOCK );
  if( pPager->eLock<eLock || pPager->eLock==UNKNOWN_LOCK ){
    rc = pPager->noLock ? SQLITE_OK : sqlite3OsLock(pPager->fd, eLock);
    if( rc==SQLITE_OK && (pPager->eLock!=UNKNOWN_LOCK||eLock==EXCLUSIVE_LOCK) ){
      pPager->eLock = (u8)eLock;
      IOTRACE(("LOCK %p %d\n", pPager, eLock))
    }
  }
  return rc;
}